

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

dlep_parser_error
dlep_extension_router_process_destination(dlep_extension *ext,dlep_session *session)

{
  int iVar1;
  oonf_layer2_neigh *poVar2;
  dlep_parser_error result;
  oonf_layer2_neigh *l2neigh;
  dlep_session *session_local;
  dlep_extension *ext_local;
  
  if (session->restrict_signal == DLEP_ALL_SIGNALS) {
    poVar2 = dlep_extension_get_l2_neighbor(session);
    if (poVar2 == (oonf_layer2_neigh *)0x0) {
      ext_local._4_4_ = DLEP_NEW_PARSER_OKAY;
    }
    else {
      iVar1 = dlep_reader_map_l2neigh_data(poVar2->data,session,ext);
      if (iVar1 == 0) {
        ext_local._4_4_ = DLEP_NEW_PARSER_OKAY;
      }
      else {
        if ((log_global_mask[session->log_source] & 2) != 0) {
          oonf_log(LOG_SEVERITY_INFO,session->log_source,"src/generic/dlep/dlep_extension.c",0x103,
                   (void *)0x0,0,"tlv mapping for extension %d failed: %d",ext->id,iVar1);
        }
        ext_local._4_4_ = DLEP_NEW_PARSER_UNSUPPORTED_TLV;
      }
    }
  }
  else {
    ext_local._4_4_ = DLEP_NEW_PARSER_OKAY;
  }
  return ext_local._4_4_;
}

Assistant:

enum dlep_parser_error
dlep_extension_router_process_destination(struct dlep_extension *ext, struct dlep_session *session) {
  struct oonf_layer2_neigh *l2neigh;
  enum dlep_parser_error result;

  if (session->restrict_signal != DLEP_ALL_SIGNALS) {
    /* ignore unless we have an established session */
    return DLEP_NEW_PARSER_OKAY;
  }

  l2neigh = dlep_extension_get_l2_neighbor(session);
  if (!l2neigh) {
    return DLEP_NEW_PARSER_OKAY;
  }

  result = dlep_reader_map_l2neigh_data(l2neigh->data, session, ext);
  if (result) {
    OONF_INFO(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return DLEP_NEW_PARSER_UNSUPPORTED_TLV;
  }
  return DLEP_NEW_PARSER_OKAY;
}